

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O0

bool cornelich::parse_date(string *date,day_point *dp)

{
  bool bVar1;
  year_month yVar2;
  day_point dVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  byte local_99;
  year local_92;
  year_month local_90;
  year_month_day local_8c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_88;
  year_month_day ymd;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  char *local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char *local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  int local_2c;
  int local_28;
  int d;
  int m;
  int y;
  day_point *dp_local;
  string *date_local;
  
  d = 0;
  local_28 = 0;
  local_2c = 0;
  _m = dp;
  dp_local = (day_point *)date;
  local_38._M_current = (char *)std::__cxx11::string::begin();
  local_48._M_current = (char *)std::__cxx11::string::begin();
  local_40 = (char *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&local_48,4);
  bVar1 = util::parse_number<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (local_38,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )local_40,&d);
  local_99 = 1;
  if (bVar1) {
    local_58._M_current = (char *)std::__cxx11::string::begin();
    local_50 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_58,4);
    local_68._M_current = (char *)std::__cxx11::string::begin();
    local_60 = (char *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(&local_68,6);
    bVar1 = util::parse_number<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (local_50,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_60,&local_28);
    local_99 = 1;
    if (bVar1) {
      local_78._M_current = (char *)std::__cxx11::string::begin();
      local_70 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_78,6);
      _Stack_88._M_current = (char *)std::__cxx11::string::begin();
      end = __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+(&stack0xffffffffffffff78,8);
      bVar1 = util::parse_number<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (local_70,end,&local_2c);
      local_99 = bVar1 ^ 0xff;
    }
  }
  if ((local_99 & 1) == 0) {
    ::date::year::year(&local_92,d);
    yVar2 = ::date::operator/(&local_92,local_28);
    local_90.y_ = yVar2.y_.y_;
    local_90.m_ = yVar2.m_.m_;
    local_8c = ::date::operator/(&local_90,local_2c);
    dVar3 = ::date::year_month_day::operator_cast_to_time_point(&local_8c);
    (_m->__d).__r = (rep_conflict)dVar3.__d.__r;
    date_local._7_1_ = ::date::year_month_day::ok(&local_8c);
  }
  else {
    date_local._7_1_ = false;
  }
  return date_local._7_1_;
}

Assistant:

bool parse_date(const std::string & date, day_point & dp)
{
    int y = 0, m = 0, d = 0;
    if(BOOST_UNLIKELY(
                !util::parse_number(date.begin(), date.begin() + 4, y) ||
                !util::parse_number(date.begin() + 4, date.begin() + 6, m) ||
                !util::parse_number(date.begin() + 6, date.begin() + 8, d)))
    {
        return false;
    }
    auto ymd = year(y)/m/d;
    dp = ymd;
    return ymd.ok();
}